

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O1

void test_export_simple_ltc(void)

{
  ostream *poVar1;
  brdf_plot plot;
  ltc ltc;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3 local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  undefined1 local_128 [16];
  undefined1 local_118 [120];
  ltc local_a0;
  
  poVar1 = log_info();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"VISUAL TEST: test_export_simple_ltc started.",0x2c);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  ::ltc::ltc(&local_a0);
  local_128._0_8_ = 0x3f800000;
  local_128._8_8_ = (brdf *)0x0;
  local_118._0_8_ = 0x3f800000;
  local_118._8_8_ = 0;
  local_118._16_4_ = 1.0;
  ::ltc::set_ltc_matrix(&local_a0,(mat3 *)local_128);
  brdf_plot::brdf_plot((brdf_plot *)local_128);
  local_148._0_8_ = 0x3f3504f3;
  local_148.field_0.z = 0.70710677;
  brdf_plot::set_view_dir((brdf_plot *)local_128,(vec3 *)&local_148.field_0);
  brdf_plot::set_resolution((brdf_plot *)local_128,0x200);
  local_148._0_8_ = &local_138;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_148,"test_export_simple_ltc.png","");
  brdf_plot::export_png((brdf_plot *)local_128,&local_a0.super_brdf,(string *)&local_148.field_0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._0_8_ != &local_138) {
    operator_delete((void *)local_148._0_8_,local_138._M_allocated_capacity + 1);
  }
  poVar1 = log_info();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"VISUAL TEST: expored to \'test_export_simple_ltc.png\'",0x34);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = log_info();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"VISUAL TEST: test_export_simple_ltc completed.",0x2e);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void test_export_simple_ltc()
{
    log_info() << "VISUAL TEST: test_export_simple_ltc started." << std::endl;

    ltc ltc;
    ltc.set_ltc_matrix(glm::mat3{1.0f});

    brdf_plot plot;
    plot.set_view_dir(glm::normalize(glm::vec3{1.0f, 0.0f, 1.0f}));
    plot.set_resolution(512);
    plot.export_png(&ltc, "test_export_simple_ltc.png");

    log_info() << "VISUAL TEST: expored to 'test_export_simple_ltc.png'"
        << std::endl;
    log_info() << "VISUAL TEST: test_export_simple_ltc completed." << std::endl;
}